

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

lys_module * lys_get_import_module_ns(lys_module *module,char *ns)

{
  int iVar1;
  lys_node **pplVar2;
  ulong uVar3;
  long lVar4;
  
  if ((module == (lys_module *)0x0) || (ns == (char *)0x0)) {
    __assert_fail("module && ns",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x9c6,
                  "const struct lys_module *lys_get_import_module_ns(const struct lys_module *, const char *)"
                 );
  }
  if ((module->field_0x40 & 1) == 0) {
    iVar1 = ly_strequal_(module->ns,ns);
    if (iVar1 != 0) {
      return module;
    }
  }
  else {
    iVar1 = ly_strequal_((char *)module->data[1].parent,ns);
    if (iVar1 != 0) {
      pplVar2 = &module->data;
LAB_001582e2:
      return (lys_module *)*pplVar2;
    }
  }
  if (module->imp_size != '\0') {
    lVar4 = 0;
    uVar3 = 0;
    do {
      iVar1 = ly_strequal_(*(char **)(*(long *)(module->imp->rev + lVar4 + -0x10) + 0xa8),ns);
      if (iVar1 != 0) {
        pplVar2 = (lys_node **)(module->imp->rev + lVar4 + -0x10);
        goto LAB_001582e2;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x38;
    } while (uVar3 < module->imp_size);
  }
  return (lys_module *)0x0;
}

Assistant:

const struct lys_module *
lys_get_import_module_ns(const struct lys_module *module, const char *ns)
{
    int i;

    assert(module && ns);

    if (module->type) {
        /* the module is actually submodule and to get the namespace, we need the main module */
        if (ly_strequal(((struct lys_submodule *)module)->belongsto->ns, ns, 0)) {
            return ((struct lys_submodule *)module)->belongsto;
        }
    } else {
        /* modul's own namespace */
        if (ly_strequal(module->ns, ns, 0)) {
            return module;
        }
    }

    /* imported modules */
    for (i = 0; i < module->imp_size; ++i) {
        if (ly_strequal(module->imp[i].module->ns, ns, 0)) {
            return module->imp[i].module;
        }
    }

    return NULL;
}